

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_aver_u_h_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  uVar4 = *(ushort *)((long)pfVar1 + 2);
  uVar5 = *(ushort *)((long)pfVar1 + 4);
  uVar6 = *(ushort *)((long)pfVar1 + 6);
  uVar7 = *(ushort *)((long)pfVar1 + 8);
  uVar8 = *(ushort *)((long)pfVar1 + 10);
  uVar9 = *(ushort *)((long)pfVar1 + 0xc);
  uVar10 = *(ushort *)((long)pfVar1 + 0xe);
  pfVar2 = (env->active_fpu).fpr + wt;
  uVar11 = *(ushort *)((long)pfVar2 + 2);
  uVar12 = *(ushort *)((long)pfVar2 + 4);
  uVar13 = *(ushort *)((long)pfVar2 + 6);
  uVar14 = *(ushort *)((long)pfVar2 + 8);
  uVar15 = *(ushort *)((long)pfVar2 + 10);
  uVar16 = *(ushort *)((long)pfVar2 + 0xc);
  uVar17 = *(ushort *)((long)pfVar2 + 0xe);
  pfVar3 = (env->active_fpu).fpr + wd;
  *(ushort *)pfVar3 =
       ((*(ushort *)pfVar2 | *(ushort *)pfVar1) & 1) +
       (*(ushort *)pfVar2 >> 1) + (*(ushort *)pfVar1 >> 1);
  *(ushort *)((long)pfVar3 + 2) = ((uVar11 | uVar4) & 1) + (uVar11 >> 1) + (uVar4 >> 1);
  *(ushort *)((long)pfVar3 + 4) = ((uVar12 | uVar5) & 1) + (uVar12 >> 1) + (uVar5 >> 1);
  *(ushort *)((long)pfVar3 + 6) = ((uVar13 | uVar6) & 1) + (uVar13 >> 1) + (uVar6 >> 1);
  *(ushort *)((long)pfVar3 + 8) = ((uVar14 | uVar7) & 1) + (uVar14 >> 1) + (uVar7 >> 1);
  *(ushort *)((long)pfVar3 + 10) = ((uVar15 | uVar8) & 1) + (uVar15 >> 1) + (uVar8 >> 1);
  *(ushort *)((long)pfVar3 + 0xc) = ((uVar16 | uVar9) & 1) + (uVar16 >> 1) + (uVar9 >> 1);
  *(ushort *)((long)pfVar3 + 0xe) = ((uVar17 | uVar10) & 1) + (uVar17 >> 1) + (uVar10 >> 1);
  return;
}

Assistant:

void helper_msa_aver_u_h(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_aver_u_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_aver_u_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_aver_u_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_aver_u_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_aver_u_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_aver_u_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_aver_u_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_aver_u_df(DF_HALF, pws->h[7],  pwt->h[7]);
}